

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O0

bool __thiscall
cmCTestRunTest::EndTest(cmCTestRunTest *this,size_t completed,size_t total,bool started)

{
  cmCTest *pcVar1;
  cmProcess *this_00;
  bool bVar2;
  int iVar3;
  int iVar4;
  pointer ppVar5;
  ostream *poVar6;
  char *pcVar7;
  ulong uVar8;
  void *this_01;
  double dVar9;
  byte local_1f69;
  string *local_1f48;
  bool local_1f39;
  int local_1eac;
  byte local_1dc2;
  byte local_1dc1;
  int local_1da0;
  undefined1 local_1d88 [7];
  bool cm_zlib_compress;
  char local_1d68 [8];
  char buffer [100];
  int seconds;
  int minutes;
  int hours;
  double ttime;
  char *reasonType;
  undefined1 local_1cd8 [7];
  bool pass;
  cmWorkingDirectory workdir;
  undefined1 local_1c98 [8];
  ostringstream cmCTestLog_msg_13;
  string local_1b20 [32];
  undefined1 local_1b00 [8];
  ostringstream cmCTestLog_msg_12;
  char local_1988 [8];
  char buf [1024];
  string local_1580 [32];
  undefined1 local_1560 [8];
  ostringstream cmCTestLog_msg_11;
  string local_13e8 [32];
  undefined1 local_13c8 [8];
  ostringstream cmCTestLog_msg_10;
  string local_1250 [32];
  undefined1 local_1230 [8];
  ostringstream cmCTestLog_msg_9;
  string local_10b8 [32];
  undefined1 local_1098 [8];
  ostringstream cmCTestLog_msg_8;
  string local_f20 [32];
  undefined1 local_f00 [8];
  ostringstream cmCTestLog_msg_7;
  string local_d88 [32];
  undefined1 local_d68 [8];
  ostringstream cmCTestLog_msg_6;
  string local_bf0 [32];
  undefined1 local_bd0 [8];
  ostringstream cmCTestLog_msg_5;
  string local_a58;
  string local_a38 [32];
  undefined1 local_a18 [8];
  ostringstream cmCTestLog_msg_4;
  string local_8a0 [32];
  undefined1 local_880 [8];
  ostringstream cmCTestLog_msg_3;
  string local_708 [32];
  undefined1 local_6e8 [8];
  ostringstream cmCTestLog_msg_2;
  string local_570 [32];
  undefined1 local_550 [8];
  ostringstream cmCTestLog_msg_1;
  string local_3d8 [32];
  undefined1 local_3b8 [8];
  ostringstream cmCTestLog_msg;
  string local_240 [32];
  undefined1 local_220 [8];
  ostringstream s;
  iterator iStack_a0;
  bool success;
  pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_98;
  __normal_iterator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_90;
  pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_88;
  __normal_iterator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_80;
  pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_78;
  byte local_6c;
  byte local_6b;
  byte local_6a;
  byte local_69;
  bool found;
  bool outputTestErrorsToConsole;
  bool skipped;
  iterator iStack_68;
  bool forceFail;
  iterator passIt;
  int retVal;
  int res;
  bool passed;
  string reason;
  bool started_local;
  size_t total_local;
  size_t completed_local;
  cmCTestRunTest *this_local;
  
  reason.field_2._M_local_buf[0xf] = started;
  if ((((this->TestHandler->MemCheck & 1U) == 0) &&
      (bVar2 = cmCTest::ShouldCompressTestOutput(this->CTest), bVar2)) ||
     (((this->TestHandler->MemCheck & 1U) != 0 &&
      (bVar2 = cmCTest::ShouldCompressTestOutput(this->CTest), bVar2)))) {
    CompressOutput(this);
  }
  WriteLogOutputTop(this,completed,total);
  std::__cxx11::string::string((string *)&res);
  if ((reason.field_2._M_local_buf[0xf] & 1U) == 0) {
    local_1da0 = 1;
  }
  else {
    local_1da0 = cmProcess::GetProcessStatus(this->TestProcess);
  }
  passIt._M_current._0_4_ = cmProcess::GetExitValue(this->TestProcess);
  __gnu_cxx::
  __normal_iterator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::__normal_iterator(&stack0xffffffffffffff98);
  local_69 = 0;
  local_6a = 0;
  local_6b = 0;
  bVar2 = std::
          vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty(&this->TestProperties->RequiredRegularExpressions);
  if ((!bVar2) &&
     (bVar2 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&this->FailedDependencies), bVar2)) {
    local_6c = 0;
    local_78 = (pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)std::
                  vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::begin(&this->TestProperties->RequiredRegularExpressions);
    iStack_68 = (iterator)local_78;
    while( true ) {
      local_80._M_current =
           (pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)std::
              vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::end(&this->TestProperties->RequiredRegularExpressions);
      bVar2 = __gnu_cxx::operator!=(&stack0xffffffffffffff98,&local_80);
      if (!bVar2) break;
      ppVar5 = __gnu_cxx::
               __normal_iterator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator->(&stack0xffffffffffffff98);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      bVar2 = cmsys::RegularExpression::find(&ppVar5->first,pcVar7);
      if (bVar2) {
        local_6c = 1;
        std::__cxx11::string::operator=((string *)&res,"Required regular expression found.");
        break;
      }
      __gnu_cxx::
      __normal_iterator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++(&stack0xffffffffffffff98);
    }
    if ((local_6c & 1) == 0) {
      std::__cxx11::string::operator=((string *)&res,"Required regular expression not found.");
      local_69 = 1;
    }
    std::__cxx11::string::operator+=((string *)&res,"Regex=[");
    local_88 = (pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)std::
                  vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::begin(&this->TestProperties->RequiredRegularExpressions);
    iStack_68 = (iterator)local_88;
    while( true ) {
      local_90._M_current =
           (pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)std::
              vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::end(&this->TestProperties->RequiredRegularExpressions);
      bVar2 = __gnu_cxx::operator!=(&stack0xffffffffffffff98,&local_90);
      if (!bVar2) break;
      ppVar5 = __gnu_cxx::
               __normal_iterator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator->(&stack0xffffffffffffff98);
      std::__cxx11::string::operator+=((string *)&res,(string *)&ppVar5->second);
      std::__cxx11::string::operator+=((string *)&res,"\n");
      __gnu_cxx::
      __normal_iterator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++(&stack0xffffffffffffff98);
    }
    std::__cxx11::string::operator+=((string *)&res,"]");
  }
  bVar2 = std::
          vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty(&this->TestProperties->ErrorRegularExpressions);
  if ((!bVar2) &&
     (bVar2 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&this->FailedDependencies), bVar2)) {
    local_98 = (pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)std::
                  vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::begin(&this->TestProperties->ErrorRegularExpressions);
    iStack_68 = (iterator)local_98;
    while( true ) {
      iStack_a0 = std::
                  vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::end(&this->TestProperties->ErrorRegularExpressions);
      bVar2 = __gnu_cxx::operator!=(&stack0xffffffffffffff98,&stack0xffffffffffffff60);
      if (!bVar2) break;
      ppVar5 = __gnu_cxx::
               __normal_iterator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator->(&stack0xffffffffffffff98);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      bVar2 = cmsys::RegularExpression::find(&ppVar5->first,pcVar7);
      if (bVar2) {
        std::__cxx11::string::operator=((string *)&res,"Error regular expression found in output.");
        std::__cxx11::string::operator+=((string *)&res," Regex=[");
        ppVar5 = __gnu_cxx::
                 __normal_iterator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator->(&stack0xffffffffffffff98);
        std::__cxx11::string::operator+=((string *)&res,(string *)&ppVar5->second);
        std::__cxx11::string::operator+=((string *)&res,"]");
        local_69 = 1;
        break;
      }
      __gnu_cxx::
      __normal_iterator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++(&stack0xffffffffffffff98);
    }
  }
  if (local_1da0 == 4) {
    local_1dc1 = 0;
    if ((local_69 & 1) == 0) {
      local_1dc2 = 1;
      if ((int)passIt._M_current != 0) {
        bVar2 = std::
                vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::empty(&this->TestProperties->RequiredRegularExpressions);
        local_1dc2 = bVar2 ^ 0xff;
      }
      local_1dc1 = local_1dc2;
    }
    if ((this->TestProperties->SkipReturnCode < 0) ||
       (this->TestProperties->SkipReturnCode != (int)passIt._M_current)) {
      if ((((local_1dc1 & 1) == 0) || ((this->TestProperties->WillFail & 1U) != 0)) &&
         (((local_1dc1 & 1) != 0 || ((this->TestProperties->WillFail & 1U) == 0)))) {
        (this->TestResult).Status = 7;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6e8);
        poVar6 = std::operator<<((ostream *)local_6e8,"***Failed  ");
        std::operator<<(poVar6,(string *)&res);
        pcVar1 = this->CTest;
        std::__cxx11::ostringstream::str();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                     ,0xe6,pcVar7,false);
        std::__cxx11::string::~string(local_708);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6e8);
        local_6b = this->CTest->OutputTestOutputOnTestFailure & 1;
      }
      else {
        (this->TestResult).Status = 9;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_550);
        std::operator<<((ostream *)local_550,"   Passed  ");
        pcVar1 = this->CTest;
        std::__cxx11::ostringstream::str();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                     ,0xe3,pcVar7,false);
        std::__cxx11::string::~string(local_570);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_550);
      }
    }
    else {
      (this->TestResult).Status = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_220);
      poVar6 = std::operator<<((ostream *)local_220,"SKIP_RETURN_CODE=");
      std::ostream::operator<<(poVar6,this->TestProperties->SkipReturnCode);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=((string *)&(this->TestResult).CompletionStatus,local_240);
      std::__cxx11::string::~string(local_240);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b8);
      std::operator<<((ostream *)local_3b8,"***Skipped ");
      pcVar1 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0xde,pcVar7,false);
      std::__cxx11::string::~string(local_3d8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b8);
      local_6a = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_220);
    }
  }
  else if (local_1da0 == 5) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_880);
    std::operator<<((ostream *)local_880,"***Timeout ");
    pcVar1 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0xea,pcVar7,false);
    std::__cxx11::string::~string(local_8a0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_880);
    (this->TestResult).Status = 1;
    local_6b = this->CTest->OutputTestOutputOnTestFailure & 1;
  }
  else if (local_1da0 == 2) {
    local_6b = this->CTest->OutputTestOutputOnTestFailure & 1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a18);
    std::operator<<((ostream *)local_a18,"***Exception: ");
    pcVar1 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0xef,pcVar7,false);
    std::__cxx11::string::~string(local_a38);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a18);
    cmProcess::GetExitExceptionString_abi_cxx11_(&local_a58,this->TestProcess);
    std::__cxx11::string::operator=
              ((string *)&(this->TestResult).ExceptionStatus,(string *)&local_a58);
    std::__cxx11::string::~string((string *)&local_a58);
    iVar3 = cmProcess::GetExitException(this->TestProcess);
    switch(iVar3) {
    case 1:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_bd0);
      std::operator<<((ostream *)local_bd0,"SegFault");
      pcVar1 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0xf4,pcVar7,false);
      std::__cxx11::string::~string(local_bf0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_bd0);
      (this->TestResult).Status = 2;
      break;
    case 2:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d68);
      std::operator<<((ostream *)local_d68,"Illegal");
      pcVar1 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0xf8,pcVar7,false);
      std::__cxx11::string::~string(local_d88);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_d68);
      (this->TestResult).Status = 3;
      break;
    case 3:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_f00);
      std::operator<<((ostream *)local_f00,"Interrupt");
      pcVar1 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0xfc,pcVar7,false);
      std::__cxx11::string::~string(local_f20);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_f00);
      (this->TestResult).Status = 4;
      break;
    case 4:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1098);
      std::operator<<((ostream *)local_1098,"Numerical");
      pcVar1 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0x100,pcVar7,false);
      std::__cxx11::string::~string(local_10b8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1098);
      (this->TestResult).Status = 5;
      break;
    default:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1230);
      std::operator<<((ostream *)local_1230,(string *)&(this->TestResult).ExceptionStatus);
      pcVar1 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0x105,pcVar7,false);
      std::__cxx11::string::~string(local_1250);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1230);
      (this->TestResult).Status = 6;
    }
  }
  else {
    bVar2 = std::operator==("Disabled",&(this->TestResult).CompletionStatus);
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_13c8);
      std::operator<<((ostream *)local_13c8,"***Not Run (Disabled) ");
      pcVar1 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0x109,pcVar7,false);
      std::__cxx11::string::~string(local_13e8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_13c8);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1560);
      std::operator<<((ostream *)local_1560,"***Not Run ");
      pcVar1 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0x10c,pcVar7,false);
      std::__cxx11::string::~string(local_1580);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1560);
    }
  }
  iVar3 = (this->TestResult).Status;
  dVar9 = cmProcess::GetTotalTime(this->TestProcess);
  sprintf(local_1988,"%6.2f sec",dVar9);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b00);
  poVar6 = std::operator<<((ostream *)local_1b00,local_1988);
  std::operator<<(poVar6,"\n");
  pcVar1 = this->CTest;
  std::__cxx11::ostringstream::str();
  pcVar7 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x112,pcVar7,false);
  std::__cxx11::string::~string(local_1b20);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b00);
  if ((local_6b & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c98);
    poVar6 = std::operator<<((ostream *)local_1c98,(string *)&this->ProcessOutput);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x115,pcVar7,false);
    std::__cxx11::string::~string((string *)(workdir.OldDir.field_2._M_local_buf + 8));
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c98);
  }
  if (this->TestHandler->LogFile != (ostream *)0x0) {
    poVar6 = std::operator<<(this->TestHandler->LogFile,"Test time = ");
    poVar6 = std::operator<<(poVar6,local_1988);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  cmWorkingDirectory::cmWorkingDirectory
            ((cmWorkingDirectory *)local_1cd8,&this->TestProperties->Directory);
  DartProcessing(this);
  cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)local_1cd8);
  if (((this->TestHandler->MemCheck & 1U) == 0) && ((reason.field_2._M_local_buf[0xf] & 1U) != 0)) {
    if ((this->TestResult).Status == 9) {
      local_1eac = this->TestHandler->CustomMaximumPassedTestOutputSize;
    }
    else {
      local_1eac = this->TestHandler->CustomMaximumFailedTestOutputSize;
    }
    cmCTestTestHandler::CleanTestOutput(this->TestHandler,&this->ProcessOutput,(long)local_1eac);
  }
  std::__cxx11::string::operator=((string *)&(this->TestResult).Reason,(string *)&res);
  if (this->TestHandler->LogFile != (ostream *)0x0) {
    bVar2 = true;
    ttime = (double)anon_var_dwarf_1d3425;
    if (((this->TestResult).Status != 9) && ((this->TestResult).Status != 0)) {
      ttime = (double)anon_var_dwarf_1d343c;
      bVar2 = false;
    }
    dVar9 = cmProcess::GetTotalTime(this->TestProcess);
    sprintf(local_1d68,"%02d:%02d:%02d",(ulong)(uint)(int)(dVar9 / 3600.0),
            (ulong)(uint)((int)(dVar9 / 60.0) % 0x3c),(ulong)(uint)((int)dVar9 % 0x3c));
    poVar6 = std::operator<<(this->TestHandler->LogFile,
                             "----------------------------------------------------------");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      poVar6 = std::operator<<(this->TestHandler->LogFile,(char *)ttime);
      poVar6 = std::operator<<(poVar6,":\n");
      poVar6 = std::operator<<(poVar6,(string *)&(this->TestResult).Reason);
      std::operator<<(poVar6,"\n");
    }
    else if (bVar2) {
      std::operator<<(this->TestHandler->LogFile,"Test Passed.\n");
    }
    else {
      std::operator<<(this->TestHandler->LogFile,"Test Failed.\n");
    }
    poVar6 = std::operator<<(this->TestHandler->LogFile,"\"");
    poVar6 = std::operator<<(poVar6,(string *)this->TestProperties);
    poVar6 = std::operator<<(poVar6,"\" end time: ");
    cmCTest::CurrentTime_abi_cxx11_((string *)local_1d88,this->CTest);
    poVar6 = std::operator<<(poVar6,(string *)local_1d88);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    poVar6 = std::operator<<(poVar6,"\"");
    poVar6 = std::operator<<(poVar6,(string *)this->TestProperties);
    poVar6 = std::operator<<(poVar6,"\" time elapsed: ");
    poVar6 = std::operator<<(poVar6,local_1d68);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    poVar6 = std::operator<<(poVar6,"----------------------------------------------------------");
    this_01 = (void *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_1d88);
  }
  if ((reason.field_2._M_local_buf[0xf] & 1U) != 0) {
    local_1f39 = false;
    if (((this->TestHandler->MemCheck & 1U) == 0) &&
       (local_1f39 = false, this->CompressionRatio <= 1.0 && this->CompressionRatio != 1.0)) {
      local_1f39 = cmCTest::ShouldCompressTestOutput(this->CTest);
    }
    if (local_1f39 == false) {
      local_1f48 = (string *)&this->ProcessOutput;
    }
    else {
      local_1f48 = (string *)&this->CompressedOutput;
    }
    std::__cxx11::string::operator=((string *)&(this->TestResult).Output,local_1f48);
    (this->TestResult).CompressOutput = local_1f39;
    iVar4 = cmProcess::GetExitValue(this->TestProcess);
    (this->TestResult).ReturnValue = iVar4;
    if ((local_6a & 1) == 0) {
      std::__cxx11::string::operator=((string *)&(this->TestResult).CompletionStatus,"Completed");
    }
    dVar9 = cmProcess::GetTotalTime(this->TestProcess);
    (this->TestResult).ExecutionTime = dVar9;
    MemCheckPostProcess(this);
    ComputeWeightedCost(this);
  }
  bVar2 = NeedsToRerun(this);
  if (!bVar2) {
    std::
    vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
    ::push_back(&this->TestHandler->TestResults,&this->TestResult);
  }
  this_00 = this->TestProcess;
  if (this_00 != (cmProcess *)0x0) {
    cmProcess::~cmProcess(this_00);
    operator_delete(this_00,0xc0);
  }
  local_1f69 = 1;
  if (iVar3 != 9) {
    local_1f69 = local_6a;
  }
  std::__cxx11::string::~string((string *)&res);
  return (bool)(local_1f69 & 1);
}

Assistant:

bool cmCTestRunTest::EndTest(size_t completed, size_t total, bool started)
{
  if ((!this->TestHandler->MemCheck &&
       this->CTest->ShouldCompressTestOutput()) ||
      (this->TestHandler->MemCheck &&
       this->CTest->ShouldCompressTestOutput())) {
    this->CompressOutput();
  }

  this->WriteLogOutputTop(completed, total);
  std::string reason;
  bool passed = true;
  int res =
    started ? this->TestProcess->GetProcessStatus() : cmsysProcess_State_Error;
  int retVal = this->TestProcess->GetExitValue();
  std::vector<std::pair<cmsys::RegularExpression, std::string> >::iterator
    passIt;
  bool forceFail = false;
  bool skipped = false;
  bool outputTestErrorsToConsole = false;
  if (!this->TestProperties->RequiredRegularExpressions.empty() &&
      this->FailedDependencies.empty()) {
    bool found = false;
    for (passIt = this->TestProperties->RequiredRegularExpressions.begin();
         passIt != this->TestProperties->RequiredRegularExpressions.end();
         ++passIt) {
      if (passIt->first.find(this->ProcessOutput.c_str())) {
        found = true;
        reason = "Required regular expression found.";
        break;
      }
    }
    if (!found) {
      reason = "Required regular expression not found.";
      forceFail = true;
    }
    reason += "Regex=[";
    for (passIt = this->TestProperties->RequiredRegularExpressions.begin();
         passIt != this->TestProperties->RequiredRegularExpressions.end();
         ++passIt) {
      reason += passIt->second;
      reason += "\n";
    }
    reason += "]";
  }
  if (!this->TestProperties->ErrorRegularExpressions.empty() &&
      this->FailedDependencies.empty()) {
    for (passIt = this->TestProperties->ErrorRegularExpressions.begin();
         passIt != this->TestProperties->ErrorRegularExpressions.end();
         ++passIt) {
      if (passIt->first.find(this->ProcessOutput.c_str())) {
        reason = "Error regular expression found in output.";
        reason += " Regex=[";
        reason += passIt->second;
        reason += "]";
        forceFail = true;
        break;
      }
    }
  }
  if (res == cmsysProcess_State_Exited) {
    bool success = !forceFail &&
      (retVal == 0 ||
       !this->TestProperties->RequiredRegularExpressions.empty());
    if (this->TestProperties->SkipReturnCode >= 0 &&
        this->TestProperties->SkipReturnCode == retVal) {
      this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
      std::ostringstream s;
      s << "SKIP_RETURN_CODE=" << this->TestProperties->SkipReturnCode;
      this->TestResult.CompletionStatus = s.str();
      cmCTestLog(this->CTest, HANDLER_OUTPUT, "***Skipped ");
      skipped = true;
    } else if ((success && !this->TestProperties->WillFail) ||
               (!success && this->TestProperties->WillFail)) {
      this->TestResult.Status = cmCTestTestHandler::COMPLETED;
      cmCTestLog(this->CTest, HANDLER_OUTPUT, "   Passed  ");
    } else {
      this->TestResult.Status = cmCTestTestHandler::FAILED;
      cmCTestLog(this->CTest, HANDLER_OUTPUT, "***Failed  " << reason);
      outputTestErrorsToConsole = this->CTest->OutputTestOutputOnTestFailure;
    }
  } else if (res == cmsysProcess_State_Expired) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "***Timeout ");
    this->TestResult.Status = cmCTestTestHandler::TIMEOUT;
    outputTestErrorsToConsole = this->CTest->OutputTestOutputOnTestFailure;
  } else if (res == cmsysProcess_State_Exception) {
    outputTestErrorsToConsole = this->CTest->OutputTestOutputOnTestFailure;
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "***Exception: ");
    this->TestResult.ExceptionStatus =
      this->TestProcess->GetExitExceptionString();
    switch (this->TestProcess->GetExitException()) {
      case cmsysProcess_Exception_Fault:
        cmCTestLog(this->CTest, HANDLER_OUTPUT, "SegFault");
        this->TestResult.Status = cmCTestTestHandler::SEGFAULT;
        break;
      case cmsysProcess_Exception_Illegal:
        cmCTestLog(this->CTest, HANDLER_OUTPUT, "Illegal");
        this->TestResult.Status = cmCTestTestHandler::ILLEGAL;
        break;
      case cmsysProcess_Exception_Interrupt:
        cmCTestLog(this->CTest, HANDLER_OUTPUT, "Interrupt");
        this->TestResult.Status = cmCTestTestHandler::INTERRUPT;
        break;
      case cmsysProcess_Exception_Numerical:
        cmCTestLog(this->CTest, HANDLER_OUTPUT, "Numerical");
        this->TestResult.Status = cmCTestTestHandler::NUMERICAL;
        break;
      default:
        cmCTestLog(this->CTest, HANDLER_OUTPUT,
                   this->TestResult.ExceptionStatus);
        this->TestResult.Status = cmCTestTestHandler::OTHER_FAULT;
    }
  } else if ("Disabled" == this->TestResult.CompletionStatus) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "***Not Run (Disabled) ");
  } else // cmsysProcess_State_Error
  {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "***Not Run ");
  }

  passed = this->TestResult.Status == cmCTestTestHandler::COMPLETED;
  char buf[1024];
  sprintf(buf, "%6.2f sec", this->TestProcess->GetTotalTime());
  cmCTestLog(this->CTest, HANDLER_OUTPUT, buf << "\n");

  if (outputTestErrorsToConsole) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, this->ProcessOutput << std::endl);
  }

  if (this->TestHandler->LogFile) {
    *this->TestHandler->LogFile << "Test time = " << buf << std::endl;
  }

  // Set the working directory to the tests directory to process Dart files.
  {
    cmWorkingDirectory workdir(this->TestProperties->Directory);
    this->DartProcessing();
  }

  // if this is doing MemCheck then all the output needs to be put into
  // Output since that is what is parsed by cmCTestMemCheckHandler
  if (!this->TestHandler->MemCheck && started) {
    this->TestHandler->CleanTestOutput(
      this->ProcessOutput,
      static_cast<size_t>(
        this->TestResult.Status == cmCTestTestHandler::COMPLETED
          ? this->TestHandler->CustomMaximumPassedTestOutputSize
          : this->TestHandler->CustomMaximumFailedTestOutputSize));
  }
  this->TestResult.Reason = reason;
  if (this->TestHandler->LogFile) {
    bool pass = true;
    const char* reasonType = "Test Pass Reason";
    if (this->TestResult.Status != cmCTestTestHandler::COMPLETED &&
        this->TestResult.Status != cmCTestTestHandler::NOT_RUN) {
      reasonType = "Test Fail Reason";
      pass = false;
    }
    double ttime = this->TestProcess->GetTotalTime();
    int hours = static_cast<int>(ttime / (60 * 60));
    int minutes = static_cast<int>(ttime / 60) % 60;
    int seconds = static_cast<int>(ttime) % 60;
    char buffer[100];
    sprintf(buffer, "%02d:%02d:%02d", hours, minutes, seconds);
    *this->TestHandler->LogFile
      << "----------------------------------------------------------"
      << std::endl;
    if (!this->TestResult.Reason.empty()) {
      *this->TestHandler->LogFile << reasonType << ":\n"
                                  << this->TestResult.Reason << "\n";
    } else {
      if (pass) {
        *this->TestHandler->LogFile << "Test Passed.\n";
      } else {
        *this->TestHandler->LogFile << "Test Failed.\n";
      }
    }
    *this->TestHandler->LogFile
      << "\"" << this->TestProperties->Name
      << "\" end time: " << this->CTest->CurrentTime() << std::endl
      << "\"" << this->TestProperties->Name << "\" time elapsed: " << buffer
      << std::endl
      << "----------------------------------------------------------"
      << std::endl
      << std::endl;
  }
  // if the test actually started and ran
  // record the results in TestResult
  if (started) {
    bool compress = !this->TestHandler->MemCheck &&
      this->CompressionRatio < 1 && this->CTest->ShouldCompressTestOutput();
    this->TestResult.Output =
      compress ? this->CompressedOutput : this->ProcessOutput;
    this->TestResult.CompressOutput = compress;
    this->TestResult.ReturnValue = this->TestProcess->GetExitValue();
    if (!skipped) {
      this->TestResult.CompletionStatus = "Completed";
    }
    this->TestResult.ExecutionTime = this->TestProcess->GetTotalTime();
    this->MemCheckPostProcess();
    this->ComputeWeightedCost();
  }
  // If the test does not need to rerun push the current TestResult onto the
  // TestHandler vector
  if (!this->NeedsToRerun()) {
    this->TestHandler->TestResults.push_back(this->TestResult);
  }
  delete this->TestProcess;
  return passed || skipped;
}